

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreStructs.cpp
# Opt level: O0

void __thiscall Assimp::Ogre::IndexData::~IndexData(IndexData *this)

{
  IndexData *this_local;
  
  Reset(this);
  std::shared_ptr<Assimp::MemoryIOStream>::~shared_ptr(&this->buffer);
  return;
}

Assistant:

IndexData::~IndexData()
{
    Reset();
}